

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

String * __thiscall flexbuffers::Reference::AsString(String *__return_storage_ptr__,Reference *this)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  if (this->type_ == FBT_KEY) {
    puVar2 = Indirect(this);
    uVar1 = this->byte_width_;
    sVar3 = strlen((char *)puVar2);
    (__return_storage_ptr__->super_Sized).super_Object.data_ = puVar2;
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = uVar1;
    (__return_storage_ptr__->super_Sized).size_ = sVar3;
  }
  else if (this->type_ == FBT_STRING) {
    puVar2 = Indirect(this);
    Sized::Sized(&__return_storage_ptr__->super_Sized,puVar2,this->byte_width_);
  }
  else {
    (__return_storage_ptr__->super_Sized).super_Object.data_ = String::EmptyString()::empty_string;
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = '\x01';
    (__return_storage_ptr__->super_Sized).size_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

String AsString() const {
    if (type_ == FBT_STRING) {
      return String(Indirect(), byte_width_);
    } else if (type_ == FBT_KEY) {
      auto key = Indirect();
      return String(key, byte_width_,
                    strlen(reinterpret_cast<const char *>(key)));
    } else {
      return String::EmptyString();
    }
  }